

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[50],cm::static_string_view,std::__cxx11::string,char[32],char_const*,char[11],std::__cxx11::string,char[3]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [50],
                   static_string_view *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [32],char **args_4,char (*args_5) [11],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
                   char (*args_7) [3])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_278;
  cmAlphaNum local_248;
  cmAlphaNum local_218;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b8;
  cmAlphaNum local_188;
  undefined8 local_158;
  size_type local_150;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  static_string_view *args_local_1;
  char (*args_local) [50];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (static_string_view *)args;
  args_local = (char (*) [50])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_e8 = cmAlphaNum::View(a);
  local_d8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_118,(char *)args_local_1);
  local_c8 = cmAlphaNum::View(&local_118);
  local_158 = *(undefined8 *)args_local_2;
  local_150 = args_local_2->_M_string_length;
  cmAlphaNum::cmAlphaNum(&local_148,*(string_view *)args_local_2);
  local_b8 = cmAlphaNum::View(&local_148);
  cmAlphaNum::cmAlphaNum(&local_188,local_38);
  local_a8 = cmAlphaNum::View(&local_188);
  cmAlphaNum::cmAlphaNum(&local_1b8,*args_3);
  local_98 = cmAlphaNum::View(&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1e8,*args_4);
  local_88 = cmAlphaNum::View(&local_1e8);
  cmAlphaNum::cmAlphaNum(&local_218,*args_5);
  local_78 = cmAlphaNum::View(&local_218);
  cmAlphaNum::cmAlphaNum(&local_248,args_6);
  local_68 = cmAlphaNum::View(&local_248);
  cmAlphaNum::cmAlphaNum(&local_278,*args_7);
  local_58 = cmAlphaNum::View(&local_278);
  local_48 = &local_e8;
  local_40 = 10;
  views._M_len = 10;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}